

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawFlags flags)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM0_Qb;
  float fVar7;
  float fVar8;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (0.5 <= rounding) {
    uVar3 = flags | 0xf0;
    if ((flags & 0x1f0U) != 0) {
      uVar3 = flags;
    }
    flags = uVar3;
    uVar3 = ~flags;
    fVar7 = 0.5;
    if ((uVar3 & 0xc0) != 0) {
      fVar7 = 1.0;
    }
    fVar8 = 0.5;
    if ((uVar3 & 0x30) != 0) {
      fVar8 = fVar7;
    }
    fVar7 = ABS(b->x - a->x) * fVar8 + -1.0;
    fVar8 = 0.5;
    if ((uVar3 & 0xa0) != 0) {
      fVar8 = 1.0;
    }
    if (fVar7 <= rounding) {
      rounding = fVar7;
    }
    fVar7 = 0.5;
    if ((uVar3 & 0x50) != 0) {
      fVar7 = fVar8;
    }
    fVar7 = ABS(b->y - a->y) * fVar7 + -1.0;
    if (fVar7 <= rounding) {
      rounding = fVar7;
    }
  }
  if ((rounding < 0.5) || ((flags & 0x1f0U) == 0x100)) {
    iVar5 = (this->_Path).Size;
    if (iVar5 == (this->_Path).Capacity) {
      if (iVar5 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar5 / 2 + iVar5;
      }
      iVar6 = iVar5 + 1;
      if (iVar5 + 1 < iVar4) {
        iVar6 = iVar4;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar6;
      iVar5 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    pIVar2[iVar5] = *a;
    iVar4 = (this->_Path).Size;
    iVar5 = iVar4 + 1;
    (this->_Path).Size = iVar5;
    fVar7 = b->x;
    fVar8 = a->y;
    if (iVar5 == (this->_Path).Capacity) {
      iVar4 = iVar4 + 2;
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      local_48 = fVar8;
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar4;
      iVar5 = (this->_Path).Size;
      fVar8 = local_48;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    pIVar2[iVar5].x = fVar7;
    pIVar2[iVar5].y = fVar8;
    iVar4 = (this->_Path).Size;
    iVar5 = iVar4 + 1;
    (this->_Path).Size = iVar5;
    if (iVar5 == (this->_Path).Capacity) {
      iVar4 = iVar4 + 2;
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar4;
      iVar5 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    pIVar2[iVar5] = *b;
    iVar4 = (this->_Path).Size;
    iVar5 = iVar4 + 1;
    (this->_Path).Size = iVar5;
    fVar7 = a->x;
    fVar8 = b->y;
    if (iVar5 == (this->_Path).Capacity) {
      iVar4 = iVar4 + 2;
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar4;
      iVar5 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    pIVar2[iVar5].x = fVar7;
    pIVar2[iVar5].y = fVar8;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    fVar7 = 0.0;
    if ((flags & 0x10U) != 0) {
      fVar7 = rounding;
    }
    local_50 = 0.0;
    if ((flags & 0x20U) != 0) {
      local_50 = rounding;
    }
    local_48 = 0.0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    if ((char)flags < '\0') {
      local_48 = rounding;
      uStack_44 = in_XMM0_Db;
      uStack_40 = (int)in_XMM0_Qb;
      uStack_3c = (int)((ulong)in_XMM0_Qb >> 0x20);
    }
    local_4c = 0.0;
    if ((flags & 0x40U) != 0) {
      local_4c = rounding;
    }
    local_58.x = fVar7 + (*a).x;
    local_58.y = fVar7 + (*a).y;
    PathArcToFast(this,&local_58,fVar7,6,9);
    local_58.y = a->y + local_50;
    local_58.x = b->x - local_50;
    PathArcToFast(this,&local_58,local_50,9,0xc);
    local_58.x = (*b).x - local_48;
    local_58.y = (*b).y - local_48;
    PathArcToFast(this,&local_58,local_48,0,3);
    local_58.y = b->y - local_4c;
    local_58.x = a->x + local_4c;
    PathArcToFast(this,&local_58,local_4c,3,6);
  }
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawFlags flags)
{
    if (rounding >= 0.5f)
    {
        flags = FixRectCornerFlags(flags);
        rounding = ImMin(rounding, ImFabs(b.x - a.x) * (((flags & ImDrawFlags_RoundCornersTop) == ImDrawFlags_RoundCornersTop) || ((flags & ImDrawFlags_RoundCornersBottom) == ImDrawFlags_RoundCornersBottom) ? 0.5f : 1.0f) - 1.0f);
        rounding = ImMin(rounding, ImFabs(b.y - a.y) * (((flags & ImDrawFlags_RoundCornersLeft) == ImDrawFlags_RoundCornersLeft) || ((flags & ImDrawFlags_RoundCornersRight) == ImDrawFlags_RoundCornersRight) ? 0.5f : 1.0f) - 1.0f);
    }
    if (rounding < 0.5f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (flags & ImDrawFlags_RoundCornersTopLeft)     ? rounding : 0.0f;
        const float rounding_tr = (flags & ImDrawFlags_RoundCornersTopRight)    ? rounding : 0.0f;
        const float rounding_br = (flags & ImDrawFlags_RoundCornersBottomRight) ? rounding : 0.0f;
        const float rounding_bl = (flags & ImDrawFlags_RoundCornersBottomLeft)  ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}